

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmStringCommand.cxx
# Opt level: O0

bool cmStringCommand(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *args,cmExecutionStatus *status)

{
  string_view key;
  initializer_list<std::pair<cm::static_string_view,_bool_(*)(const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&,_cmExecutionStatus_&)>_>
  init;
  cmExecutionStatus *this;
  bool bVar1;
  int iVar2;
  const_reference this_00;
  _func_bool_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_ptr_cmExecutionStatus_ptr
  *local_698;
  string_view local_690;
  _func_bool_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_ptr_cmExecutionStatus_ptr
  *local_680;
  string_view local_678;
  _func_bool_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_ptr_cmExecutionStatus_ptr
  *local_668;
  string_view local_660;
  _func_bool_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_ptr_cmExecutionStatus_ptr
  *local_650;
  string_view local_648;
  _func_bool_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_ptr_cmExecutionStatus_ptr
  *local_638;
  string_view local_630;
  _func_bool_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_ptr_cmExecutionStatus_ptr
  *local_620;
  string_view local_618;
  _func_bool_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_ptr_cmExecutionStatus_ptr
  *local_608;
  string_view local_600;
  _func_bool_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_ptr_cmExecutionStatus_ptr
  *local_5f0;
  string_view local_5e8;
  _func_bool_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_ptr_cmExecutionStatus_ptr
  *local_5d8;
  string_view local_5d0;
  _func_bool_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_ptr_cmExecutionStatus_ptr
  *local_5c0;
  string_view local_5b8;
  _func_bool_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_ptr_cmExecutionStatus_ptr
  *local_5a8;
  string_view local_5a0;
  _func_bool_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_ptr_cmExecutionStatus_ptr
  *local_590;
  string_view local_588;
  _func_bool_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_ptr_cmExecutionStatus_ptr
  *local_578;
  string_view local_570;
  _func_bool_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_ptr_cmExecutionStatus_ptr
  *local_560;
  string_view local_558;
  _func_bool_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_ptr_cmExecutionStatus_ptr
  *local_548;
  string_view local_540;
  _func_bool_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_ptr_cmExecutionStatus_ptr
  *local_530;
  string_view local_528;
  _func_bool_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_ptr_cmExecutionStatus_ptr
  *local_518;
  string_view local_510;
  _func_bool_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_ptr_cmExecutionStatus_ptr
  *local_500;
  string_view local_4f8;
  _func_bool_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_ptr_cmExecutionStatus_ptr
  *local_4e8;
  string_view local_4e0;
  _func_bool_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_ptr_cmExecutionStatus_ptr
  *local_4d0;
  string_view local_4c8;
  _func_bool_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_ptr_cmExecutionStatus_ptr
  *local_4b8;
  string_view local_4b0;
  _func_bool_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_ptr_cmExecutionStatus_ptr
  *local_4a0;
  string_view local_498;
  _func_bool_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_ptr_cmExecutionStatus_ptr
  *local_488;
  string_view local_480;
  _func_bool_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_ptr_cmExecutionStatus_ptr
  *local_470;
  string_view local_468;
  _func_bool_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_ptr_cmExecutionStatus_ptr
  *local_458;
  string_view local_450;
  _func_bool_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_ptr_cmExecutionStatus_ptr
  *local_440;
  string_view local_438;
  _func_bool_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_ptr_cmExecutionStatus_ptr
  *local_428;
  string_view local_420;
  _func_bool_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_ptr_cmExecutionStatus_ptr
  *local_410;
  string_view local_408;
  _func_bool_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_ptr_cmExecutionStatus_ptr
  *local_3f8;
  string_view local_3f0;
  _func_bool_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_ptr_cmExecutionStatus_ptr
  *local_3e0;
  string_view local_3d8;
  _func_bool_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_ptr_cmExecutionStatus_ptr
  *local_3c8;
  string_view local_3c0;
  _func_bool_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_ptr_cmExecutionStatus_ptr
  *local_3b0;
  string_view local_3a8;
  _func_bool_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_ptr_cmExecutionStatus_ptr
  *local_398;
  string_view local_390;
  pair<cm::static_string_view,_bool_(*)(const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&,_cmExecutionStatus_&)>
  local_380;
  pair<cm::static_string_view,_bool_(*)(const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&,_cmExecutionStatus_&)>
  local_368;
  pair<cm::static_string_view,_bool_(*)(const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&,_cmExecutionStatus_&)>
  local_350;
  pair<cm::static_string_view,_bool_(*)(const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&,_cmExecutionStatus_&)>
  local_338;
  pair<cm::static_string_view,_bool_(*)(const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&,_cmExecutionStatus_&)>
  local_320;
  pair<cm::static_string_view,_bool_(*)(const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&,_cmExecutionStatus_&)>
  local_308;
  pair<cm::static_string_view,_bool_(*)(const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&,_cmExecutionStatus_&)>
  local_2f0;
  pair<cm::static_string_view,_bool_(*)(const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&,_cmExecutionStatus_&)>
  local_2d8;
  pair<cm::static_string_view,_bool_(*)(const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&,_cmExecutionStatus_&)>
  local_2c0;
  pair<cm::static_string_view,_bool_(*)(const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&,_cmExecutionStatus_&)>
  local_2a8;
  pair<cm::static_string_view,_bool_(*)(const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&,_cmExecutionStatus_&)>
  local_290;
  pair<cm::static_string_view,_bool_(*)(const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&,_cmExecutionStatus_&)>
  local_278;
  pair<cm::static_string_view,_bool_(*)(const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&,_cmExecutionStatus_&)>
  local_260;
  pair<cm::static_string_view,_bool_(*)(const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&,_cmExecutionStatus_&)>
  local_248;
  pair<cm::static_string_view,_bool_(*)(const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&,_cmExecutionStatus_&)>
  local_230;
  pair<cm::static_string_view,_bool_(*)(const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&,_cmExecutionStatus_&)>
  local_218;
  pair<cm::static_string_view,_bool_(*)(const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&,_cmExecutionStatus_&)>
  local_200;
  pair<cm::static_string_view,_bool_(*)(const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&,_cmExecutionStatus_&)>
  local_1e8;
  pair<cm::static_string_view,_bool_(*)(const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&,_cmExecutionStatus_&)>
  local_1d0;
  pair<cm::static_string_view,_bool_(*)(const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&,_cmExecutionStatus_&)>
  local_1b8;
  pair<cm::static_string_view,_bool_(*)(const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&,_cmExecutionStatus_&)>
  local_1a0;
  pair<cm::static_string_view,_bool_(*)(const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&,_cmExecutionStatus_&)>
  local_188;
  pair<cm::static_string_view,_bool_(*)(const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&,_cmExecutionStatus_&)>
  local_170;
  pair<cm::static_string_view,_bool_(*)(const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&,_cmExecutionStatus_&)>
  local_158;
  pair<cm::static_string_view,_bool_(*)(const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&,_cmExecutionStatus_&)>
  local_140;
  pair<cm::static_string_view,_bool_(*)(const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&,_cmExecutionStatus_&)>
  local_128;
  pair<cm::static_string_view,_bool_(*)(const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&,_cmExecutionStatus_&)>
  local_110;
  pair<cm::static_string_view,_bool_(*)(const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&,_cmExecutionStatus_&)>
  local_f8;
  pair<cm::static_string_view,_bool_(*)(const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&,_cmExecutionStatus_&)>
  local_e0;
  pair<cm::static_string_view,_bool_(*)(const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&,_cmExecutionStatus_&)>
  local_c8;
  pair<cm::static_string_view,_bool_(*)(const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&,_cmExecutionStatus_&)>
  local_b0;
  pair<cm::static_string_view,_bool_(*)(const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&,_cmExecutionStatus_&)>
  local_98;
  pair<cm::static_string_view,_bool_(*)(const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&,_cmExecutionStatus_&)>
  local_80;
  iterator local_68;
  undefined8 local_60;
  allocator<char> local_41;
  string local_40;
  cmExecutionStatus *local_20;
  cmExecutionStatus *status_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *args_local;
  
  local_20 = status;
  status_local = (cmExecutionStatus *)args;
  bVar1 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::empty(args);
  this = local_20;
  if (bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_40,"must be called with at least one argument.",&local_41);
    cmExecutionStatus::SetError(this,&local_40);
    std::__cxx11::string::~string((string *)&local_40);
    std::allocator<char>::~allocator(&local_41);
    args_local._7_1_ = false;
  }
  else {
    if (cmStringCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)
        ::subcommand == '\0') {
      iVar2 = __cxa_guard_acquire(&cmStringCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)
                                   ::subcommand);
      if (iVar2 != 0) {
        local_390 = (string_view)cm::operator____s("REGEX",5);
        local_398 = anon_unknown.dwarf_7ef79c::HandleRegexCommand;
        std::
        pair<cm::static_string_view,_bool_(*)(const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&,_cmExecutionStatus_&)>
        ::pair<cm::static_string_view,_true>(&local_380,(static_string_view *)&local_390,&local_398)
        ;
        local_3a8 = (string_view)cm::operator____s("REPLACE",7);
        local_3b0 = anon_unknown.dwarf_7ef79c::HandleReplaceCommand;
        std::
        pair<cm::static_string_view,_bool_(*)(const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&,_cmExecutionStatus_&)>
        ::pair<cm::static_string_view,_true>(&local_368,(static_string_view *)&local_3a8,&local_3b0)
        ;
        local_3c0 = (string_view)cm::operator____s("MD5",3);
        local_3c8 = anon_unknown.dwarf_7ef79c::HandleHashCommand;
        std::
        pair<cm::static_string_view,_bool_(*)(const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&,_cmExecutionStatus_&)>
        ::pair<cm::static_string_view,_true>(&local_350,(static_string_view *)&local_3c0,&local_3c8)
        ;
        local_3d8 = (string_view)cm::operator____s("SHA1",4);
        local_3e0 = anon_unknown.dwarf_7ef79c::HandleHashCommand;
        std::
        pair<cm::static_string_view,_bool_(*)(const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&,_cmExecutionStatus_&)>
        ::pair<cm::static_string_view,_true>(&local_338,(static_string_view *)&local_3d8,&local_3e0)
        ;
        local_3f0 = (string_view)cm::operator____s("SHA224",6);
        local_3f8 = anon_unknown.dwarf_7ef79c::HandleHashCommand;
        std::
        pair<cm::static_string_view,_bool_(*)(const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&,_cmExecutionStatus_&)>
        ::pair<cm::static_string_view,_true>(&local_320,(static_string_view *)&local_3f0,&local_3f8)
        ;
        local_408 = (string_view)cm::operator____s("SHA256",6);
        local_410 = anon_unknown.dwarf_7ef79c::HandleHashCommand;
        std::
        pair<cm::static_string_view,_bool_(*)(const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&,_cmExecutionStatus_&)>
        ::pair<cm::static_string_view,_true>(&local_308,(static_string_view *)&local_408,&local_410)
        ;
        local_420 = (string_view)cm::operator____s("SHA384",6);
        local_428 = anon_unknown.dwarf_7ef79c::HandleHashCommand;
        std::
        pair<cm::static_string_view,_bool_(*)(const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&,_cmExecutionStatus_&)>
        ::pair<cm::static_string_view,_true>(&local_2f0,(static_string_view *)&local_420,&local_428)
        ;
        local_438 = (string_view)cm::operator____s("SHA512",6);
        local_440 = anon_unknown.dwarf_7ef79c::HandleHashCommand;
        std::
        pair<cm::static_string_view,_bool_(*)(const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&,_cmExecutionStatus_&)>
        ::pair<cm::static_string_view,_true>(&local_2d8,(static_string_view *)&local_438,&local_440)
        ;
        local_450 = (string_view)cm::operator____s("SHA3_224",8);
        local_458 = anon_unknown.dwarf_7ef79c::HandleHashCommand;
        std::
        pair<cm::static_string_view,_bool_(*)(const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&,_cmExecutionStatus_&)>
        ::pair<cm::static_string_view,_true>(&local_2c0,(static_string_view *)&local_450,&local_458)
        ;
        local_468 = (string_view)cm::operator____s("SHA3_256",8);
        local_470 = anon_unknown.dwarf_7ef79c::HandleHashCommand;
        std::
        pair<cm::static_string_view,_bool_(*)(const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&,_cmExecutionStatus_&)>
        ::pair<cm::static_string_view,_true>(&local_2a8,(static_string_view *)&local_468,&local_470)
        ;
        local_480 = (string_view)cm::operator____s("SHA3_384",8);
        local_488 = anon_unknown.dwarf_7ef79c::HandleHashCommand;
        std::
        pair<cm::static_string_view,_bool_(*)(const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&,_cmExecutionStatus_&)>
        ::pair<cm::static_string_view,_true>(&local_290,(static_string_view *)&local_480,&local_488)
        ;
        local_498 = (string_view)cm::operator____s("SHA3_512",8);
        local_4a0 = anon_unknown.dwarf_7ef79c::HandleHashCommand;
        std::
        pair<cm::static_string_view,_bool_(*)(const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&,_cmExecutionStatus_&)>
        ::pair<cm::static_string_view,_true>(&local_278,(static_string_view *)&local_498,&local_4a0)
        ;
        local_4b0 = (string_view)cm::operator____s("TOLOWER",7);
        local_4b8 = anon_unknown.dwarf_7ef79c::HandleToLowerCommand;
        std::
        pair<cm::static_string_view,_bool_(*)(const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&,_cmExecutionStatus_&)>
        ::pair<cm::static_string_view,_true>(&local_260,(static_string_view *)&local_4b0,&local_4b8)
        ;
        local_4c8 = (string_view)cm::operator____s("TOUPPER",7);
        local_4d0 = anon_unknown.dwarf_7ef79c::HandleToUpperCommand;
        std::
        pair<cm::static_string_view,_bool_(*)(const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&,_cmExecutionStatus_&)>
        ::pair<cm::static_string_view,_true>(&local_248,(static_string_view *)&local_4c8,&local_4d0)
        ;
        local_4e0 = (string_view)cm::operator____s("COMPARE",7);
        local_4e8 = anon_unknown.dwarf_7ef79c::HandleCompareCommand;
        std::
        pair<cm::static_string_view,_bool_(*)(const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&,_cmExecutionStatus_&)>
        ::pair<cm::static_string_view,_true>(&local_230,(static_string_view *)&local_4e0,&local_4e8)
        ;
        local_4f8 = (string_view)cm::operator____s("ASCII",5);
        local_500 = anon_unknown.dwarf_7ef79c::HandleAsciiCommand;
        std::
        pair<cm::static_string_view,_bool_(*)(const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&,_cmExecutionStatus_&)>
        ::pair<cm::static_string_view,_true>(&local_218,(static_string_view *)&local_4f8,&local_500)
        ;
        local_510 = (string_view)cm::operator____s("HEX",3);
        local_518 = anon_unknown.dwarf_7ef79c::HandleHexCommand;
        std::
        pair<cm::static_string_view,_bool_(*)(const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&,_cmExecutionStatus_&)>
        ::pair<cm::static_string_view,_true>(&local_200,(static_string_view *)&local_510,&local_518)
        ;
        local_528 = (string_view)cm::operator____s("CONFIGURE",9);
        local_530 = anon_unknown.dwarf_7ef79c::HandleConfigureCommand;
        std::
        pair<cm::static_string_view,_bool_(*)(const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&,_cmExecutionStatus_&)>
        ::pair<cm::static_string_view,_true>(&local_1e8,(static_string_view *)&local_528,&local_530)
        ;
        local_540 = (string_view)cm::operator____s("LENGTH",6);
        local_548 = anon_unknown.dwarf_7ef79c::HandleLengthCommand;
        std::
        pair<cm::static_string_view,_bool_(*)(const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&,_cmExecutionStatus_&)>
        ::pair<cm::static_string_view,_true>(&local_1d0,(static_string_view *)&local_540,&local_548)
        ;
        local_558 = (string_view)cm::operator____s("APPEND",6);
        local_560 = anon_unknown.dwarf_7ef79c::HandleAppendCommand;
        std::
        pair<cm::static_string_view,_bool_(*)(const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&,_cmExecutionStatus_&)>
        ::pair<cm::static_string_view,_true>(&local_1b8,(static_string_view *)&local_558,&local_560)
        ;
        local_570 = (string_view)cm::operator____s("PREPEND",7);
        local_578 = anon_unknown.dwarf_7ef79c::HandlePrependCommand;
        std::
        pair<cm::static_string_view,_bool_(*)(const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&,_cmExecutionStatus_&)>
        ::pair<cm::static_string_view,_true>(&local_1a0,(static_string_view *)&local_570,&local_578)
        ;
        local_588 = (string_view)cm::operator____s("CONCAT",6);
        local_590 = anon_unknown.dwarf_7ef79c::HandleConcatCommand;
        std::
        pair<cm::static_string_view,_bool_(*)(const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&,_cmExecutionStatus_&)>
        ::pair<cm::static_string_view,_true>(&local_188,(static_string_view *)&local_588,&local_590)
        ;
        local_5a0 = (string_view)cm::operator____s("JOIN",4);
        local_5a8 = anon_unknown.dwarf_7ef79c::HandleJoinCommand;
        std::
        pair<cm::static_string_view,_bool_(*)(const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&,_cmExecutionStatus_&)>
        ::pair<cm::static_string_view,_true>(&local_170,(static_string_view *)&local_5a0,&local_5a8)
        ;
        local_5b8 = (string_view)cm::operator____s("SUBSTRING",9);
        local_5c0 = anon_unknown.dwarf_7ef79c::HandleSubstringCommand;
        std::
        pair<cm::static_string_view,_bool_(*)(const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&,_cmExecutionStatus_&)>
        ::pair<cm::static_string_view,_true>(&local_158,(static_string_view *)&local_5b8,&local_5c0)
        ;
        local_5d0 = (string_view)cm::operator____s("STRIP",5);
        local_5d8 = anon_unknown.dwarf_7ef79c::HandleStripCommand;
        std::
        pair<cm::static_string_view,_bool_(*)(const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&,_cmExecutionStatus_&)>
        ::pair<cm::static_string_view,_true>(&local_140,(static_string_view *)&local_5d0,&local_5d8)
        ;
        local_5e8 = (string_view)cm::operator____s("REPEAT",6);
        local_5f0 = anon_unknown.dwarf_7ef79c::HandleRepeatCommand;
        std::
        pair<cm::static_string_view,_bool_(*)(const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&,_cmExecutionStatus_&)>
        ::pair<cm::static_string_view,_true>(&local_128,(static_string_view *)&local_5e8,&local_5f0)
        ;
        local_600 = (string_view)cm::operator____s("RANDOM",6);
        local_608 = anon_unknown.dwarf_7ef79c::HandleRandomCommand;
        std::
        pair<cm::static_string_view,_bool_(*)(const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&,_cmExecutionStatus_&)>
        ::pair<cm::static_string_view,_true>(&local_110,(static_string_view *)&local_600,&local_608)
        ;
        local_618 = (string_view)cm::operator____s("FIND",4);
        local_620 = anon_unknown.dwarf_7ef79c::HandleFindCommand;
        std::
        pair<cm::static_string_view,_bool_(*)(const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&,_cmExecutionStatus_&)>
        ::pair<cm::static_string_view,_true>(&local_f8,(static_string_view *)&local_618,&local_620);
        local_630 = (string_view)cm::operator____s("TIMESTAMP",9);
        local_638 = anon_unknown.dwarf_7ef79c::HandleTimestampCommand;
        std::
        pair<cm::static_string_view,_bool_(*)(const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&,_cmExecutionStatus_&)>
        ::pair<cm::static_string_view,_true>(&local_e0,(static_string_view *)&local_630,&local_638);
        local_648 = (string_view)cm::operator____s("MAKE_C_IDENTIFIER",0x11);
        local_650 = anon_unknown.dwarf_7ef79c::HandleMakeCIdentifierCommand;
        std::
        pair<cm::static_string_view,_bool_(*)(const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&,_cmExecutionStatus_&)>
        ::pair<cm::static_string_view,_true>(&local_c8,(static_string_view *)&local_648,&local_650);
        local_660 = (string_view)cm::operator____s("GENEX_STRIP",0xb);
        local_668 = anon_unknown.dwarf_7ef79c::HandleGenexStripCommand;
        std::
        pair<cm::static_string_view,_bool_(*)(const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&,_cmExecutionStatus_&)>
        ::pair<cm::static_string_view,_true>(&local_b0,(static_string_view *)&local_660,&local_668);
        local_678 = (string_view)cm::operator____s("UUID",4);
        local_680 = anon_unknown.dwarf_7ef79c::HandleUuidCommand;
        std::
        pair<cm::static_string_view,_bool_(*)(const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&,_cmExecutionStatus_&)>
        ::pair<cm::static_string_view,_true>(&local_98,(static_string_view *)&local_678,&local_680);
        local_690 = (string_view)cm::operator____s("JSON",4);
        local_698 = anon_unknown.dwarf_7ef79c::HandleJSONCommand;
        std::
        pair<cm::static_string_view,_bool_(*)(const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&,_cmExecutionStatus_&)>
        ::pair<cm::static_string_view,_true>(&local_80,(static_string_view *)&local_690,&local_698);
        local_68 = &local_380;
        local_60 = 0x21;
        init._M_len = 0x21;
        init._M_array = local_68;
        cmSubcommandTable::cmSubcommandTable(&cmStringCommand::subcommand,init);
        __cxa_atexit(cmSubcommandTable::~cmSubcommandTable,&cmStringCommand::subcommand,
                     &__dso_handle);
        __cxa_guard_release(&cmStringCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)
                             ::subcommand);
      }
    }
    this_00 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)status_local,0);
    key = (string_view)std::__cxx11::string::operator_cast_to_basic_string_view((string *)this_00);
    args_local._7_1_ =
         cmSubcommandTable::operator()
                   (&cmStringCommand::subcommand,key,
                    (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)status_local,local_20);
  }
  return args_local._7_1_;
}

Assistant:

bool cmStringCommand(std::vector<std::string> const& args,
                     cmExecutionStatus& status)
{
  if (args.empty()) {
    status.SetError("must be called with at least one argument.");
    return false;
  }

  static cmSubcommandTable const subcommand{
    { "REGEX"_s, HandleRegexCommand },
    { "REPLACE"_s, HandleReplaceCommand },
    { "MD5"_s, HandleHashCommand },
    { "SHA1"_s, HandleHashCommand },
    { "SHA224"_s, HandleHashCommand },
    { "SHA256"_s, HandleHashCommand },
    { "SHA384"_s, HandleHashCommand },
    { "SHA512"_s, HandleHashCommand },
    { "SHA3_224"_s, HandleHashCommand },
    { "SHA3_256"_s, HandleHashCommand },
    { "SHA3_384"_s, HandleHashCommand },
    { "SHA3_512"_s, HandleHashCommand },
    { "TOLOWER"_s, HandleToLowerCommand },
    { "TOUPPER"_s, HandleToUpperCommand },
    { "COMPARE"_s, HandleCompareCommand },
    { "ASCII"_s, HandleAsciiCommand },
    { "HEX"_s, HandleHexCommand },
    { "CONFIGURE"_s, HandleConfigureCommand },
    { "LENGTH"_s, HandleLengthCommand },
    { "APPEND"_s, HandleAppendCommand },
    { "PREPEND"_s, HandlePrependCommand },
    { "CONCAT"_s, HandleConcatCommand },
    { "JOIN"_s, HandleJoinCommand },
    { "SUBSTRING"_s, HandleSubstringCommand },
    { "STRIP"_s, HandleStripCommand },
    { "REPEAT"_s, HandleRepeatCommand },
    { "RANDOM"_s, HandleRandomCommand },
    { "FIND"_s, HandleFindCommand },
    { "TIMESTAMP"_s, HandleTimestampCommand },
    { "MAKE_C_IDENTIFIER"_s, HandleMakeCIdentifierCommand },
    { "GENEX_STRIP"_s, HandleGenexStripCommand },
    { "UUID"_s, HandleUuidCommand },
    { "JSON"_s, HandleJSONCommand },
  };

  return subcommand(args[0], args, status);
}